

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall
helics::HandleManager::addEndpointAlias
          (HandleManager *this,string_view interfaceName,string_view alias)

{
  bool bVar1;
  runtime_error *this_00;
  pointer ppVar2;
  key_type *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  pVar3;
  pair<std::__detail::_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>,_bool>
  res;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
  *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff48;
  InterfaceHandle *this_01;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
  *in_stack_ffffffffffffff50;
  char **__args;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
  *in_stack_ffffffffffffff60;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_88;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_80;
  BaseType local_64;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_60;
  undefined1 local_58;
  BaseType local_4c;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_48;
  undefined1 local_40;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
  local_30 [6];
  
  local_30[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
       ::find(in_stack_ffffffffffffff38,(key_type *)0x56df90);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::__detail::operator==(local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_80._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
         ::find(in_stack_ffffffffffffff38,(key_type *)0x56e0f8);
    local_30[0]._M_cur = local_80._M_cur;
    local_88._M_cur =
         (__node_type *)
         std::
         unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar1 = std::__detail::operator==(local_30,&local_88);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                             *)0x56e156);
      InterfaceHandle::baseValue(&ppVar2->second);
      std::
      unordered_map<std::basic_string_view<char,std::char_traits<char>>,helics::InterfaceHandle,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,helics::InterfaceHandle>>>
      ::emplace<std::basic_string_view<char,std::char_traits<char>>&,int>
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
  }
  else {
    __args = &in_RDI[8]._M_str;
    ppVar2 = std::__detail::
             _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                           *)0x56dfee);
    local_4c = InterfaceHandle::baseValue(&ppVar2->second);
    pVar3 = std::
            unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>_>_>
            ::try_emplace<int>(in_stack_ffffffffffffff60,in_RDI,(int *)__args);
    local_60._M_cur =
         (__node_type *)
         pVar3.first.
         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_true>
         ._M_cur;
    local_58 = pVar3.second;
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_48._M_cur = local_60._M_cur;
      local_40 = local_58;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                             *)0x56e051);
      this_01 = &ppVar2->second;
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_helics::InterfaceHandle>,_false,_true>
                             *)0x56e067);
      local_64 = (ppVar2->second).hid;
      bVar1 = InterfaceHandle::operator!=(this_01,(InterfaceHandle)local_64);
      if (bVar1) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"endpoint name and alias already exists");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return;
}

Assistant:

void HandleManager::addEndpointAlias(std::string_view interfaceName, std::string_view alias)
{
    auto fnd = endpoints.find(interfaceName);
    if (fnd != endpoints.end()) {
        auto res = endpoints.try_emplace(alias, fnd->second.baseValue());
        if (!res.second && res.first->second != fnd->second) {
            throw std::runtime_error("endpoint name and alias already exists");
        }
    } else {
        fnd = endpoints.find(alias);
        if (fnd != endpoints.end()) {
            endpoints.emplace(interfaceName, fnd->second.baseValue());
        }
    }
}